

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

CMCondition CMCondition_find(CMControlList cl,int condition)

{
  uint in_ESI;
  long in_RDI;
  CMCondition next;
  CMCondition local_20;
  
  local_20 = *(CMCondition *)(in_RDI + 0xa8);
  while( true ) {
    if (local_20 == (CMCondition)0x0) {
      fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n",
              (ulong)in_ESI);
      return (CMCondition)0x0;
    }
    if (local_20->condition_num == in_ESI) break;
    local_20 = local_20->next;
  }
  return local_20;
}

Assistant:

static CMCondition
CMCondition_find(CMControlList cl, int condition)
{
    CMCondition next = cl->condition_list;
    while (next != NULL) {
	if (next->condition_num == condition) {
	    return next;
	}
	next = next->next;
    }
    fprintf(stderr, "Serious internal error.  Use of condition %d, no longer in control list\n", condition);
    return NULL;
}